

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_lcp_2way_unstable<false>
               (uchar **from0,lcp_t *lcp_input0,size_t n0,uchar **from1,lcp_t *lcp_input1,size_t n1,
               uchar **result,lcp_t *lcp_result)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  lcp_t *plVar4;
  uchar **ppuVar5;
  uchar **ppuVar6;
  char *__assertion;
  long lVar7;
  lcp_t *local_80;
  size_t local_78;
  lcp_t local_70;
  lcp_t local_68;
  uchar **local_60;
  lcp_t *local_58;
  uchar **local_50;
  lcp_t local_40;
  int local_38;
  
  poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
  poVar3 = std::operator<<(poVar3,"merge_lcp_2way_unstable");
  poVar3 = std::operator<<(poVar3,"(): n0=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  poVar3 = std::operator<<(poVar3,", n1=");
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::operator<<(poVar3,'\n');
  check_input(from0,lcp_input0,n0);
  check_input(from1,lcp_input1,n1);
  compare((uchar *)&local_40,*from0,(size_t)*from1);
  if (local_38 < 1) {
    local_70 = local_40;
    local_60 = from0 + 1;
    *result = *from0;
    n0 = n0 - 1;
    local_68 = *lcp_input0;
    local_58 = lcp_input0 + 1;
    local_80 = lcp_input1;
  }
  else {
    *result = *from1;
    local_50 = result + 1;
    n1 = n1 - 1;
    local_60 = from0;
    if (n1 == 0) {
LAB_00214b06:
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,'~');
      poVar3 = std::operator<<(poVar3,"merge_lcp_2way_unstable");
      poVar3 = std::operator<<(poVar3,"(): n0=");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", n1=");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,'\n');
      n1 = n0;
joined_r0x00214c17:
      if (n1 == 0) {
        return;
      }
      memmove(local_50,local_60,n1 << 3);
      return;
    }
    from1 = from1 + 1;
    local_68 = local_40;
    local_70 = *lcp_input1;
    local_80 = lcp_input1 + 1;
    local_60 = from0;
    local_58 = lcp_input0;
  }
  local_50 = result + 1;
  local_78 = n0;
  ppuVar6 = local_60;
LAB_00214795:
  do {
    lVar7 = 0;
    ppuVar5 = local_50;
    while( true ) {
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,"Starting loop, n0=");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", n1=");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ...\n");
      poVar3 = std::operator<<(poVar3,"\tprev  = \'");
      poVar3 = std::operator<<(poVar3,*(char **)((long)local_50 + lVar7 + -8));
      poVar3 = std::operator<<(poVar3,"\'\n");
      poVar3 = std::operator<<(poVar3,"\tfrom0 = \'");
      poVar3 = std::operator<<(poVar3,(char *)*ppuVar6);
      poVar3 = std::operator<<(poVar3,"\'\n");
      poVar3 = std::operator<<(poVar3,"\tfrom1 = \'");
      poVar3 = std::operator<<(poVar3,*(char **)((long)from1 + lVar7));
      poVar3 = std::operator<<(poVar3,"\'\n");
      poVar3 = std::operator<<(poVar3,"\tlcp0  = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,"\n");
      poVar3 = std::operator<<(poVar3,"\tlcp1  = ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,"\n");
      std::operator<<(poVar3,"\n");
      check_lcps(*(uchar **)((long)local_50 + lVar7 + -8),*ppuVar6,local_68,
                 *(uchar **)((long)from1 + lVar7),local_70);
      if (local_70 < local_68) break;
      n0 = local_78;
      local_60 = ppuVar6;
      if (local_70 <= local_68) {
        compare((uchar *)&local_40,*ppuVar6,*(size_t *)((long)from1 + lVar7));
        local_68 = local_40;
        if (local_38 < 0) {
          *(uchar **)((long)local_50 + lVar7) = *ppuVar6;
          if (local_78 == 1) goto LAB_00214b9c;
          local_70 = local_40;
          goto LAB_00214a15;
        }
        if (local_38 != 0) {
          *(undefined8 *)((long)local_50 + lVar7) = *(undefined8 *)((long)from1 + lVar7);
          if (n1 == 1) {
            local_50 = (uchar **)((long)local_50 + lVar7 + 8);
            goto LAB_00214b06;
          }
          local_50 = (uchar **)((long)local_50 + lVar7 + 8);
          n1 = n1 - 1;
          from1 = (uchar **)((long)from1 + lVar7 + 8);
          local_80 = (lcp_t *)((long)local_80 + lVar7 + 8);
          local_70 = local_80[-1];
          goto LAB_00214795;
        }
        iVar2 = cmp(*ppuVar6,*(void **)((long)from1 + lVar7));
        if (iVar2 != 0) {
          __assert_fail("cmp(*from0, *from1)==0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x664,
                        "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                       );
        }
        if (local_78 == 0) {
          __assertion = "n0";
        }
        else {
          if (n1 != 0) {
            *(uchar **)((long)local_50 + lVar7) = *ppuVar6;
            *(undefined8 *)((long)local_50 + lVar7 + 8) = *(undefined8 *)((long)from1 + lVar7);
            n0 = local_78 - 1;
            if (n0 == 0) {
              n1 = n1 - 1;
              local_50 = (uchar **)((long)local_50 + lVar7 + 0x10);
              lVar7 = lVar7 + 8;
              goto LAB_00214ba9;
            }
            local_60 = ppuVar6 + 1;
            if (n1 == 1) {
              local_50 = (uchar **)((long)local_50 + lVar7 + 0x10);
              goto LAB_00214b06;
            }
            lVar1 = lVar7 + 0x10;
            n1 = n1 - 1;
            plVar4 = (lcp_t *)((long)local_80 + lVar7);
            local_80 = plVar4 + 1;
            local_70 = *plVar4;
            lVar7 = lVar7 + 8;
            goto LAB_00214a19;
          }
          __assertion = "n1";
        }
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x665,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                     );
      }
      iVar2 = cmp(*ppuVar6,*(void **)((long)from1 + lVar7));
      if (iVar2 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x655,
                      "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                     );
      }
      ppuVar5 = ppuVar5 + 1;
      *(undefined8 *)((long)local_50 + lVar7) = *(undefined8 *)((long)from1 + lVar7);
      local_70 = *(ulong *)((long)local_80 + lVar7);
      lVar7 = lVar7 + 8;
      n1 = n1 - 1;
      if (n1 == 0) {
        local_50 = (uchar **)((long)local_50 + lVar7);
        goto LAB_00214b06;
      }
    }
    iVar2 = cmp(*ppuVar6,*(void **)((long)from1 + lVar7));
    if (-1 < iVar2) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x64f,
                    "void merge_lcp_2way_unstable(unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict, size_t, unsigned char **, lcp_t *__restrict) [OutputLCP = false]"
                   );
    }
    *(uchar **)((long)local_50 + lVar7) = *ppuVar6;
    if (local_78 == 1) {
LAB_00214b9c:
      local_50 = ppuVar5 + 1;
LAB_00214ba9:
      local_60 = (uchar **)((long)from1 + lVar7);
      poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&__debug_indent_str_abi_cxx11_);
      poVar3 = std::operator<<(poVar3,'~');
      poVar3 = std::operator<<(poVar3,"merge_lcp_2way_unstable");
      poVar3 = std::operator<<(poVar3,"(): n0=");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3,", n1=");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,'\n');
      goto joined_r0x00214c17;
    }
LAB_00214a15:
    local_80 = (lcp_t *)((long)local_80 + lVar7);
    lVar1 = lVar7 + 8;
LAB_00214a19:
    from1 = (uchar **)((long)from1 + lVar7);
    local_50 = (uchar **)((long)local_50 + lVar1);
    local_78 = local_78 - 1;
    ppuVar6 = ppuVar6 + 1;
    local_68 = *local_58;
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

static void
merge_lcp_2way_unstable(
               unsigned char** from0,  lcp_t* restrict lcp_input0, size_t n0,
               unsigned char** from1,  lcp_t* restrict lcp_input1, size_t n1,
               unsigned char** result, lcp_t* restrict lcp_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	check_input(from0, lcp_input0, n0);
	check_input(from1, lcp_input1, n1);
	lcp_t lcp0=0, lcp1=0;
	int cmp01; lcp_t lcp01;
	std::tie(cmp01, lcp01) = compare(*from0, *from1);
	if (cmp01 <= 0) {
		*result++ = *from0++;
		lcp0 = *lcp_input0++;
		lcp1 = lcp01;
		if (--n0 == 0) goto finish0;
	} else {
		*result++ = *from1++;
		lcp1 = *lcp_input1++;
		lcp0 = lcp01;
		if (--n1 == 0) goto finish1;
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
		        << "\tprev  = '" <<*(result-1)<<"'\n"
		        << "\tfrom0 = '"<<*from0<<"'\n"
		        << "\tfrom1 = '"<<*from1<<"'\n"
		        << "\tlcp0  = " << lcp0 << "\n"
		        << "\tlcp1  = " << lcp1 << "\n"
		        << "\n";
		check_lcps(*(result-1),*from0,lcp0,*from1,lcp1);
		if (lcp0 > lcp1) {
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			lcp0 = *lcp_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			lcp1 = *lcp_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			int cmp01; lcp_t lcp01;
			std::tie(cmp01,lcp01) = compare(*from0, *from1, lcp0);
			if (cmp01 < 0) {
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp1 = lcp01;
				if (--n0 == 0) goto finish0;
				lcp0 = *lcp_input0++;
			} else if (cmp01 == 0) {
				assert(cmp(*from0, *from1)==0);
				assert(n0); assert(n1);
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *lcp_result++ = lcp01;
				*result++ = *from0++;
				*result++ = *from1++;
				--n0;
				--n1;
				lcp0 = *lcp_input0++;
				lcp1 = *lcp_input1++;
				if (n0 == 0) goto finish0;
				if (n1 == 0) goto finish1;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp0;
				lcp0 = lcp01;
				if (--n1 == 0) goto finish1;
				lcp1 = *lcp_input1++;
			}
		}
	}
finish0:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n0);
	if (n1) {
		std::copy(from1, from1+n1, result);
		if (OutputLCP) *lcp_result++ = lcp1;
		if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	}
	return;
finish1:
	debug() << '~' << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';
	assert(not n1);
	if (n0) {
		std::copy(from0, from0+n0, result);
		if (OutputLCP) *lcp_result++ = lcp0;
		if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	}
	return;
}